

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O2

Col_Word Col_NewStringBuffer(size_t capacity,Col_StringFormat format)

{
  Cell *pacVar1;
  ulong uVar2;
  size_t number;
  
  if ((format & 0x10) == 0) {
    if (capacity == 0) {
      number = 5;
    }
    else {
      uVar2 = 0x1fffc8 / (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1));
      if (uVar2 < capacity) {
        capacity = uVar2;
      }
      uVar2 = (ulong)((int)capacity * (format & (COL_UCS4|COL_UCS2|COL_UCS1)) + 0x37 >> 5);
      number = 0xffff;
      if (uVar2 < 0xffff) {
        number = uVar2;
      }
    }
    pacVar1 = AllocCells(number);
    (*pacVar1)[0] = 'r';
    (*pacVar1)[1] = (char)format;
    *(short *)(*pacVar1 + 2) = (short)number;
    *(char *)((long)pacVar1 + 8) = '\f';
    *(char *)((long)pacVar1 + 9) = '\0';
    *(char *)((long)pacVar1 + 10) = '\0';
    *(char *)((long)pacVar1 + 0xb) = '\0';
    *(char *)((long)pacVar1 + 0xc) = '\0';
    *(char *)((long)pacVar1 + 0xd) = '\0';
    *(char *)((long)pacVar1 + 0xe) = '\0';
    *(char *)((long)pacVar1 + 0xf) = '\0';
    *(char *)((long)pacVar1 + 0x10) = '\0';
    *(char *)((long)pacVar1 + 0x11) = '\0';
    *(char *)((long)pacVar1 + 0x12) = '\0';
    *(char *)((long)pacVar1 + 0x13) = '\0';
    *(char *)((long)pacVar1 + 0x14) = '\0';
    *(char *)((long)pacVar1 + 0x15) = '\0';
    *(char *)((long)pacVar1 + 0x16) = '\0';
    *(char *)((long)pacVar1 + 0x17) = '\0';
  }
  else {
    pacVar1 = (Cell *)0x0;
    Col_Error(COL_VALUECHECK,ColibriDomain,0x26,format);
  }
  return (Col_Word)pacVar1;
}

Assistant:

Col_Word
Col_NewStringBuffer(
    size_t capacity,            /*!< Maximum length of string buffer. If zero,
                                     use a default value. */
    Col_StringFormat format)    /*!< String format. */
{
    Col_Word strbuf;            /* Resulting word in the general case. */
    size_t size;                /* Number of allocated cells storing a minimum
                                 * of **capacity** elements. */

    /*
     * Check preconditions.
     */
    
    /*! @valuecheck{COL_ERROR_STRBUF_FORMAT,format} */
    VALUECHECK_STRBUF_FORMAT(format) return WORD_NIL;

    /*
     * Create a new string buffer word.
     */

    if (capacity == 0) {
        size = STRBUF_DEFAULT_SIZE;
    } else {
        size_t max = Col_MaxStringBufferLength(format);
        if (capacity > max) capacity = max;
        size = STRBUF_SIZE(capacity * CHAR_WIDTH(format));
        if (size > STRBUF_MAX_SIZE) size = STRBUF_MAX_SIZE;
    }
    strbuf = (Col_Word) AllocCells(size);
    WORD_STRBUF_INIT(strbuf, size, format);

    return strbuf;
}